

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O1

string * __thiscall
(anonymous_namespace)::getStringAttribute_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,xmlNodePtr type,char *att_name
          )

{
  char *__s;
  size_t sVar1;
  MissingAttribute *this_00;
  allocator local_69;
  string local_68;
  string local_48;
  
  __s = (char *)xmlGetProp(this,type);
  if (__s != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
    (*_xmlFree)(__s);
    return __return_storage_ptr__;
  }
  this_00 = (MissingAttribute *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string((string *)&local_48,(char *)type,&local_69);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Parsing::MissingAttribute::MissingAttribute(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&Parsing::MissingAttribute::typeinfo,
              Parsing::MissingAttribute::~MissingAttribute);
}

Assistant:

std::string getStringAttribute(xmlNodePtr type, const char* att_name)
    {
        xmlChar* att = xmlGetProp(type, reinterpret_cast<const xmlChar*>(att_name) );
        if (! att)
            throw Parsing::MissingAttribute(att_name, "");
        std::string ret( reinterpret_cast<const char*>(att));
        xmlFree(att);
        return ret;
    }